

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O3

void __thiscall
mp::VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::VarInfoImpl
          (VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *this,double ft,
          bool recomp_vals,vector<double,_std::allocator<double>_> *x,ArrayRef<double> *x_raw,
          ArrayRef<mp::var::Type> *type,ArrayRef<double> *lb,ArrayRef<double> *ub,int sol_rnd,
          int sol_prec)

{
  pointer pdVar1;
  
  this->feastol_ = ft;
  this->recomp_vals_ = recomp_vals;
  pdVar1 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
  (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar1;
  (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this->x_raw_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->x_raw_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->x_raw_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->x_raw_).data_ = x_raw->data_;
  (this->x_raw_).size_ = x_raw->size_;
  (this->type_).save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->type_).save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->type_).save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->type_).data_ = type->data_;
  (this->type_).size_ = type->size_;
  (this->lb_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lb_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lb_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lb_).data_ = lb->data_;
  (this->lb_).size_ = lb->size_;
  (this->ub_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ub_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ub_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ub_).data_ = ub->data_;
  (this->ub_).size_ = ub->size_;
  this->sol_rnd_ = 100;
  this->sol_prec_ = 100;
  apply_precision_options(this,sol_rnd,sol_prec);
  return;
}

Assistant:

VarInfoImpl(double ft, bool recomp_vals,
              VarVec x,
              ArrayRef<double> x_raw,
              ArrayRef<var::Type> type,
              ArrayRef<double> lb, ArrayRef<double> ub,
              int sol_rnd, int sol_prec)
      : feastol_(ft), recomp_vals_(recomp_vals),
      x_(std::move(x)), x_raw_(x_raw),
      type_(type), lb_(lb), ub_(ub) {
    assert((int)x_.size()>=(int)type_.size());  // feasrelax can add more
    assert(type_.size()==lb_.size());
    assert(type_.size()==ub_.size());
    apply_precision_options(sol_rnd, sol_prec); // after recomp?
  }